

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O2

unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> __thiscall
flow::lang::Parser::ifStmt(Parser *this)

{
  Lexer *pLVar1;
  Report *this_00;
  undefined1 auVar2 [8];
  _Alloc_hider _Var3;
  bool bVar4;
  int iVar5;
  LiteralType args;
  Parser *in_RSI;
  undefined1 local_90 [8];
  undefined1 local_88 [16];
  undefined1 local_78 [8];
  string local_70;
  SourceLocation sloc;
  
  SourceLocation::SourceLocation
            (&sloc,&((in_RSI->lexer_)._M_t.
                     super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                     .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl)->location_);
  consume(in_RSI,If);
  logicExpr((Parser *)local_90);
  consumeIf(in_RSI,Then);
  iVar5 = (**(code **)(*(long *)local_90 + 0x18))();
  if (iVar5 == 1) {
LAB_00124155:
    stmt((Parser *)(local_78 + 8));
    if ((_Base_ptr)local_70._M_dataplus._M_p != (_Base_ptr)0x0) {
      local_88._0_8_ =
           (__uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>)0x0;
      bVar4 = consumeIf(in_RSI,Else);
      if (bVar4) {
        stmt((Parser *)local_78);
        local_88._4_4_ = local_78._4_4_;
        local_88._0_4_ = local_78._0_4_;
        if ((_Head_base<0UL,_flow::lang::Expr_*,_false>)local_88._0_8_ !=
            (_Head_base<0UL,_flow::lang::Expr_*,_false>)0x0) goto LAB_001241a3;
        *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
      }
      else {
LAB_001241a3:
        pLVar1 = (in_RSI->lexer_)._M_t.
                 super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                 .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
        sloc.end.offset = (pLVar1->lastLocation_).end.offset;
        sloc.end.line = (pLVar1->lastLocation_).end.line;
        sloc.end.column = (pLVar1->lastLocation_).end.column;
        std::
        make_unique<flow::lang::CondStmt,std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,std::unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>>,std::unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>>,flow::SourceLocation&>
                  ((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)local_78,
                   (unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> *)local_90,
                   (unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> *)
                   (local_78 + 8),(SourceLocation *)local_88);
        *(ulong *)&(this->features_)._M_t._M_impl = CONCAT44(local_78._4_4_,local_78._0_4_);
        if ((Expr *)local_88._0_8_ != (Expr *)0x0) {
          (*((ASTNode *)local_88._0_8_)->_vptr_ASTNode[1])();
        }
      }
      if ((_Base_ptr)local_70._M_dataplus._M_p != (_Base_ptr)0x0) {
        (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
      }
      goto LAB_00124251;
    }
  }
  else {
    if (iVar5 == 3) {
      local_88._0_2_ = 0x37;
      pLVar1 = (in_RSI->lexer_)._M_t.
               super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>.
               _M_t.
               super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
               super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
      sloc.end.offset = (pLVar1->lastLocation_).end.offset;
      sloc.end.line = (pLVar1->lastLocation_).end.line;
      sloc.end.column = (pLVar1->lastLocation_).end.column;
      std::
      make_unique<flow::lang::UnaryExpr,flow::Opcode,std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,flow::SourceLocation&>
                ((Opcode *)(local_78 + 8),
                 (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)local_88,
                 (SourceLocation *)local_90);
      _Var3._M_p = local_70._M_dataplus._M_p;
      auVar2 = local_90;
      local_70._M_dataplus._M_p = (pointer)0x0;
      local_90 = (undefined1  [8])_Var3._M_p;
      if (auVar2 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)auVar2 + 8))();
        if ((_Base_ptr)local_70._M_dataplus._M_p != (_Base_ptr)0x0) {
          (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
        }
      }
      local_88._14_2_ = 0x22;
      local_78._0_4_ = 0;
      std::make_unique<flow::lang::LiteralExpr<long_long>,int,flow::SourceLocation&>
                ((int *)local_88,(SourceLocation *)local_78);
      std::
      make_unique<flow::lang::BinaryExpr,flow::Opcode,std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,std::unique_ptr<flow::lang::LiteralExpr<long_long>,std::default_delete<flow::lang::LiteralExpr<long_long>>>>
                ((Opcode *)(local_78 + 8),
                 (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)
                 (local_88 + 0xe),
                 (unique_ptr<flow::lang::LiteralExpr<long_long>,_std::default_delete<flow::lang::LiteralExpr<long_long>_>_>
                  *)local_90);
      _Var3._M_p = local_70._M_dataplus._M_p;
      auVar2 = local_90;
      local_70._M_dataplus._M_p = (pointer)0x0;
      local_90 = (undefined1  [8])_Var3._M_p;
      if (auVar2 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)auVar2 + 8))();
        if ((_Base_ptr)local_70._M_dataplus._M_p != (_Base_ptr)0x0) {
          (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
        }
      }
      local_70._M_dataplus._M_p = (pointer)0x0;
      if ((Expr *)local_88._0_8_ != (Expr *)0x0) {
        (*((ASTNode *)local_88._0_8_)->_vptr_ASTNode[1])();
      }
      goto LAB_00124155;
    }
    pLVar1 = (in_RSI->lexer_)._M_t.
             super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>._M_t.
             super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
             super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
    this_00 = in_RSI->report_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_78 + 8),
               "If expression must be boolean type. Received type {} instead.",
               (allocator<char> *)local_88);
    args = (**(code **)(*(long *)local_90 + 0x18))();
    diagnostics::Report::typeError<flow::LiteralType>
              (this_00,&pLVar1->lastLocation_,(string *)(local_78 + 8),args);
    std::__cxx11::string::~string((string *)(local_78 + 8));
  }
  *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
LAB_00124251:
  if (local_90 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_90 + 8))();
  }
  std::__cxx11::string::~string((string *)&sloc);
  return (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)
         (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Stmt> Parser::ifStmt() {
  // ifStmt ::= 'if' expr ['then'] stmt ['else' stmt]
  SourceLocation sloc(location());

  consume(Token::If);
  std::unique_ptr<Expr> cond(expr());
  consumeIf(Token::Then);

  switch (cond->getType()) {
    case LiteralType::Boolean:
      break;
    case LiteralType::String:
      cond = std::make_unique<UnaryExpr>(Opcode::SLEN, std::move(cond), sloc.update(end()));
      cond = std::make_unique<BinaryExpr>(Opcode::NCMPNE, std::move(cond),
          std::make_unique<NumberExpr>(0, sloc));
      break;
    default:
      report_.typeError(
          lastLocation(),
          "If expression must be boolean type. Received type {} instead.",
          cond->getType());
      return nullptr;
  }

  std::unique_ptr<Stmt> thenStmt(stmt());
  if (!thenStmt) return nullptr;

  std::unique_ptr<Stmt> elseStmt;

  if (consumeIf(Token::Else)) {
    elseStmt = stmt();
    if (!elseStmt) {
      return nullptr;
    }
  }

  return std::make_unique<CondStmt>(std::move(cond), std::move(thenStmt),
                                    std::move(elseStmt), sloc.update(end()));
}